

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O2

void __thiscall
HModel::util_reportRowVecSol
          (HModel *this,int nrow,vector<double,_std::allocator<double>_> *XrowLower,
          vector<double,_std::allocator<double>_> *XrowUpper,
          vector<double,_std::allocator<double>_> *XrowPrimal,
          vector<double,_std::allocator<double>_> *XrowDual,
          vector<int,_std::allocator<int>_> *XrowStatus)

{
  double *pdVar1;
  double dVar2;
  char *__format;
  ulong uVar3;
  
  if (0 < nrow) {
    puts("Row    St      Primal       Lower       Upper        Dual");
    for (uVar3 = 0; (uint)nrow != uVar3; uVar3 = uVar3 + 1) {
      switch((XrowStatus->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start[uVar3]) {
      case 0:
        dVar2 = (XrowLower->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar3];
        pdVar1 = (XrowUpper->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start + uVar3;
        if ((dVar2 != *pdVar1) || (NAN(dVar2) || NAN(*pdVar1))) {
          __format = "%6d LB";
        }
        else {
          __format = "%6d FX";
        }
        break;
      case 1:
        __format = "%6d BC";
        break;
      case 2:
        __format = "%6d UB";
        break;
      case 3:
        __format = "%6d FR";
        break;
      default:
        __format = "%6d ??";
      }
      printf(__format,uVar3 & 0xffffffff);
      printf(" %11g %11g %11g %11g\n",
             (XrowPrimal->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start[uVar3],
             (XrowLower->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start[uVar3],
             (XrowUpper->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start[uVar3],
             (XrowDual->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start[uVar3]);
    }
  }
  return;
}

Assistant:

void HModel::util_reportRowVecSol(int nrow, vector<double>& XrowLower, vector<double>& XrowUpper,
			      vector<double>& XrowPrimal, vector<double>& XrowDual, vector<int>& XrowStatus) {
  // Report the LP row data and solution passed to the method, where
  // XrowStatus is the SCIP-like basis status
  if (nrow <= 0) return;
  printf("Row    St      Primal       Lower       Upper        Dual\n");
  for (int row = 0; row < nrow; row++) {
    if (XrowStatus[row] == HSOL_BASESTAT_BASIC)
      printf("%6d BC", row);
    else if (XrowStatus[row] == HSOL_BASESTAT_ZERO)
      printf("%6d FR", row);
    else if (XrowStatus[row] == HSOL_BASESTAT_LOWER) {
      if (XrowLower[row] == XrowUpper[row])
	printf("%6d FX", row);
      else
	printf("%6d LB", row);
    }
    else if (XrowStatus[row] == HSOL_BASESTAT_UPPER)
      printf("%6d UB", row);
    else
      printf("%6d ??", row);
    printf(" %11g %11g %11g %11g\n", XrowPrimal[row], XrowLower[row], XrowUpper[row], XrowDual[row]);
  }
}